

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

string * __thiscall
Kraken::KClient::signature
          (string *__return_storage_ptr__,KClient *this,string *path,string *nonce,string *postdata)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  uchar *local_d0;
  uchar *local_c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  const_iterator local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_postdata;
  allocator<unsigned_char> local_59;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string *postdata_local;
  string *nonce_local;
  string *path_local;
  KClient *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)postdata;
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_59);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,local_50,local_58,
             &local_59);
  std::allocator<unsigned_char>::~allocator(&local_59);
  std::operator+(&local_a8,nonce,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  sha256((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_b8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_b0,&local_b8);
  local_c0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  local_c8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  local_d0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,
                                 local_b0,local_c0,
                                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_c8);
  b64_decode(&local_100,&this->secret_);
  hmac_sha512(&local_e8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,&local_100
             );
  b64_encode_abi_cxx11_(__return_storage_ptr__,(Kraken *)&local_e8,data_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string KClient::signature(const std::string& path, 
			    const std::string& nonce, 
			    const std::string& postdata) const
{
   // add path to data to encrypt
   std::vector<unsigned char> data(path.begin(), path.end());

   // concatenate nonce and postdata and compute SHA256
   std::vector<unsigned char> nonce_postdata = sha256(nonce + postdata);

   // concatenate path and nonce_postdata (path + sha256(nonce + postdata))
   data.insert(data.end(), nonce_postdata.begin(), nonce_postdata.end());

   // and compute HMAC
   return b64_encode( hmac_sha512(data, b64_decode(secret_)) );
}